

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O3

double __thiscall Alg::max_cover_lazy(Alg *this,int targetSize,int mode)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar1;
  size_t sVar2;
  iterator iVar3;
  pointer puVar4;
  pointer pvVar5;
  ulong *puVar6;
  pointer pvVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 extraout_RAX;
  undefined7 uVar12;
  ostream *poVar11;
  int iVar13;
  uint *puVar14;
  pointer *ppuVar15;
  long lVar16;
  uint *puVar17;
  ulong *puVar18;
  ulong uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined4 in_register_00000034;
  ulong uVar22;
  double dVar23;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  double dVar30;
  ulong uVar31;
  long lVar32;
  Alg *pAVar33;
  bool bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  value_type argmaxIdx;
  RRsets degMap;
  FRset coverage;
  Nodelist vecBound;
  uint local_12c;
  pointer local_128;
  allocator_type local_119;
  ulong local_118;
  Alg *local_110;
  int local_104;
  size_type local_100;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_e0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b0;
  long local_a8;
  ulong local_a0;
  vector<bool,_std::allocator<bool>_> local_98;
  long local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  long local_50;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_48;
  long local_40;
  pointer local_38;
  
  local_b0 = CONCAT44(in_register_00000034,targetSize);
  this->__boundLast = 1.79769313486232e+308;
  this->__boundMin = 1.79769313486232e+308;
  local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_104 = mode;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_e0,(ulong)this->__numV,(value_type_conflict2 *)&local_98,
             (allocator_type *)&local_f8);
  uVar10 = (ulong)this->__numV;
  if (uVar10 == 0) {
    uVar31 = 0;
  }
  else {
    ppuVar15 = (pointer *)
               ((long)&(this->__hyperG)._FRsets.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar10 - 1].
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data + 8);
    uVar31 = 0;
    do {
      uVar22 = (long)*ppuVar15 - (long)((_Vector_impl_data *)(ppuVar15 + -1))->_M_start >> 3;
      if (uVar31 < uVar22) {
        uVar31 = uVar22;
      }
      ppuVar15 = ppuVar15 + -3;
      local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10 - 1] = uVar22;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_f8,uVar31 + 1,(allocator_type *)&local_98);
  uVar21 = local_b0;
  uVar9 = this->__numV - 1;
  local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT44(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p._4_4_,uVar9);
  local_110 = this;
  if (this->__numV != 0) {
    do {
      if (local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] != 0) {
        pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                 (local_f8.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9]);
        iVar3._M_current = *(uint **)(pvVar1 + 8);
        if (iVar3._M_current == *(uint **)(pvVar1 + 0x10)) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(pvVar1,iVar3,(uint *)&local_98);
        }
        else {
          *iVar3._M_current = uVar9;
          *(uint **)(pvVar1 + 8) = iVar3._M_current + 1;
        }
      }
      bVar34 = (int)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != 0;
      uVar9 = (int)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p - 1;
      local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p =
           (_Bit_type *)
           CONCAT44(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,uVar9);
    } while (bVar34);
  }
  pAVar33 = local_110;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_98,local_110->__numRRsets,(bool *)&local_68,(allocator_type *)&local_12c);
  puVar4 = (pAVar33->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pAVar33->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (pAVar33->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  bVar34 = true;
  if (uVar31 != 0) {
    local_48 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&pAVar33->__vecSeed;
    local_100 = (size_type)(int)uVar21;
    local_50 = local_100 * 4 + -4;
    local_a8 = 0;
    do {
      lVar16 = (long)local_f8.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar31].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_f8.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar31].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
      local_118 = uVar31;
      if (lVar16 != 0) {
        local_38 = local_f8.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar31;
        dVar30 = (double)(lVar16 >> 2);
        lVar27 = -(long)dVar30;
        local_70 = lVar16 + -4;
        local_40 = uVar31 * 3;
LAB_00105047:
        local_12c = (local_38->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start[(long)dVar30 + -1];
        uVar10 = local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[local_12c];
        if (local_118 <= uVar10) {
          if ((local_104 == 2) ||
             ((uVar20 = uVar21, local_104 == 1 &&
              ((long)(pAVar33->__vecSeed).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pAVar33->__vecSeed).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2 == local_100)))) {
            this_00 = &local_68;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (this_00,local_100,&local_119);
            uVar20 = local_b0;
            uVar31 = local_118;
            if ((int)uVar21 == 0) {
              local_128 = (pointer)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
              dVar23 = dVar30;
            }
            else {
              puVar4 = (&((local_f8.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start)[local_40];
              lVar16 = 0;
              do {
                uVar12 = (undefined7)
                         ((ulong)local_e0.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 8);
                if (lVar27 == lVar16) {
                  dVar23 = -NAN;
                  lVar16 = lVar16 + local_100;
                  if (lVar16 != 0) goto LAB_0010518a;
                  local_128 = (pointer)CONCAT71(uVar12,1);
                  goto LAB_0010521a;
                }
                this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          (ulong)(uint)local_e0.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start
                                       [*(uint *)((long)puVar4 + lVar16 * 4 + local_70)];
                iVar13 = (int)lVar16;
                *(uint *)(CONCAT71(local_68.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._1_7_,
                                   local_68.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._0_1_) + local_50 +
                         lVar16 * 4) =
                     (uint)local_e0.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start
                           [*(uint *)((long)puVar4 + lVar16 * 4 + local_70)];
                lVar16 = lVar16 + -1;
              } while ((int)uVar21 + iVar13 != 1);
              local_128 = (pointer)CONCAT71(uVar12,1);
              dVar23 = (double)(lVar16 - lVar27);
            }
            goto LAB_0010521a;
          }
          goto LAB_00105509;
        }
        pvVar1 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                 (local_f8.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar10);
        iVar3._M_current = *(uint **)(pvVar1 + 8);
        if (iVar3._M_current == *(uint **)(pvVar1 + 0x10)) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>(pvVar1,iVar3,&local_12c);
        }
        else {
          *iVar3._M_current = local_12c;
          *(uint **)(pvVar1 + 8) = iVar3._M_current + 1;
        }
        goto LAB_00105626;
      }
LAB_00105650:
      puVar4 = local_f8.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar7 = local_f8.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      if (puVar4 != (pointer)0x0) {
        pvVar7 = local_f8.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        local_f8.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_f8.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        operator_delete(puVar4,(long)(pvVar7->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)puVar4);
        pvVar7 = local_f8.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_f8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar7;
      uVar31 = local_118 - 1;
    } while (uVar31 != 0);
    bVar34 = true;
  }
LAB_0010577d:
  uVar9 = pAVar33->__numV;
  if (local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_f8);
  if (local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (bVar34) {
    local_c8 = (double)uVar9;
  }
  return local_c8;
  while( true ) {
    puVar4 = local_f8.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar31].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    this_00 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
              ((long)puVar4 -
               (long)local_f8.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar31].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    iVar13 = (int)lVar16;
    lVar16 = 0;
    while ((long)&(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_start + lVar16 != 0) {
      iVar8 = (int)lVar16;
      *(int *)(CONCAT71(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._1_7_,
                        local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_1_) + (long)iVar13 * 4 + -4 +
              lVar16 * 4) =
           (int)local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[puVar4[lVar16 + -1]];
      lVar16 = lVar16 + -1;
      if (iVar13 + iVar8 == 1) {
        dVar23 = (double)((long)this_00 + lVar16);
        pAVar33 = local_110;
        goto LAB_0010521a;
      }
    }
    lVar16 = iVar13 + lVar16;
    pAVar33 = local_110;
    if (lVar16 == 0) break;
LAB_0010518a:
    uVar31 = uVar31 - 1;
    local_128 = (pointer)CONCAT71((int7)((ulong)this_00 >> 8),uVar31 != 0);
    if (uVar31 == 0) {
      local_128 = (pointer)0x0;
      uVar31 = 0;
      break;
    }
  }
LAB_0010521a:
  puVar14 = (uint *)CONCAT71(local_68.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._1_7_,
                             local_68.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._0_1_);
  uVar22 = (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar14 >> 2;
  if ((1 < uVar22) && (1 < uVar22 + 1)) {
    uVar24 = uVar22 + 1 >> 1;
    do {
      uVar25 = uVar24 - 1;
      uVar9 = puVar14[uVar24 - 1];
      uVar19 = uVar24 * 2 - 1;
      uVar26 = uVar25;
      if (uVar19 < uVar22) {
        lVar16 = uVar24 * 2 + -2;
        do {
          uVar29 = puVar14[uVar19];
          uVar24 = uVar19;
          uVar28 = uVar29;
          if ((lVar16 + 2U != uVar22) &&
             (uVar24 = lVar16 + 2U, uVar28 = puVar14[lVar16 + 2], uVar29 < puVar14[lVar16 + 2])) {
            uVar24 = uVar19;
            uVar28 = uVar29;
          }
          if (uVar9 <= uVar28) break;
          puVar14[uVar26] = uVar28;
          lVar16 = uVar24 * 2;
          uVar19 = uVar24 * 2 + 1;
          uVar26 = uVar24;
        } while (uVar19 < uVar22);
      }
      puVar14[uVar26] = uVar9;
      uVar24 = uVar25;
    } while (uVar25 != 0);
  }
  if ((char)local_128 != '\0') {
    if (dVar23 != 0.0) {
      puVar4 = local_f8.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar31].
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (uVar31 <= *puVar14) goto LAB_0010545e;
        uVar24 = local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[puVar4[(long)dVar23 + -1]];
        if (*puVar14 < uVar24) {
          if (uVar22 < 2) {
            uVar19 = 0;
          }
          else {
            uVar26 = 1;
            lVar16 = 0;
            uVar19 = 0;
            do {
              uVar9 = puVar14[uVar26];
              uVar25 = uVar26;
              uVar29 = uVar9;
              if ((lVar16 + 2U != uVar22) &&
                 (uVar25 = lVar16 + 2U, uVar29 = puVar14[lVar16 + 2], uVar9 < puVar14[lVar16 + 2]))
              {
                uVar25 = uVar26;
                uVar29 = uVar9;
              }
              if (uVar24 <= uVar29) break;
              puVar14[uVar19] = uVar29;
              lVar16 = uVar25 * 2;
              uVar26 = uVar25 * 2 + 1;
              uVar19 = uVar25;
            } while (uVar26 < uVar22);
          }
          puVar14[uVar19] = (uint)uVar24;
          pAVar33 = local_110;
        }
        dVar23 = (double)((long)dVar23 + -1);
      } while (dVar23 != 0.0);
    }
    uVar31 = uVar31 - 1;
    if (uVar31 != 0) {
      local_128 = local_f8.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      do {
        puVar4 = local_f8.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar31].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar16 = (long)local_f8.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar31].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar4;
        if (lVar16 != 0) {
          lVar16 = lVar16 >> 2;
          do {
            if (uVar31 <= *puVar14) goto LAB_0010545e;
            uVar24 = local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[puVar4[lVar16 + -1]];
            if (*puVar14 < uVar24) {
              if (uVar22 < 2) {
                uVar19 = 0;
              }
              else {
                uVar26 = 1;
                lVar32 = 0;
                uVar19 = 0;
                do {
                  uVar9 = puVar14[uVar26];
                  uVar25 = uVar26;
                  uVar29 = uVar9;
                  if ((lVar32 + 2U != uVar22) &&
                     (uVar25 = lVar32 + 2U, uVar29 = puVar14[lVar32 + 2],
                     uVar9 < puVar14[lVar32 + 2])) {
                    uVar25 = uVar26;
                    uVar29 = uVar9;
                  }
                  if (uVar24 <= uVar29) break;
                  puVar14[uVar19] = uVar29;
                  lVar32 = uVar25 * 2;
                  uVar26 = uVar25 * 2 + 1;
                  uVar19 = uVar25;
                } while (uVar26 < uVar22);
              }
              puVar14[uVar19] = (uint)uVar24;
              pAVar33 = local_110;
            }
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
        }
        uVar31 = uVar31 - 1;
      } while (uVar31 != 0);
    }
  }
LAB_0010545e:
  lVar16 = 0;
  for (puVar17 = puVar14;
      puVar17 !=
      local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish; puVar17 = puVar17 + 1) {
    lVar16 = lVar16 + (ulong)*puVar17;
  }
  lVar16 = lVar16 + local_a8;
  auVar35._8_4_ = (int)((ulong)lVar16 >> 0x20);
  auVar35._0_8_ = lVar16;
  auVar35._12_4_ = 0x45300000;
  sVar2 = pAVar33->__numRRsets;
  auVar36._8_4_ = (int)(sVar2 >> 0x20);
  auVar36._0_8_ = sVar2;
  auVar36._12_4_ = 0x45300000;
  dVar23 = ((double)pAVar33->__numV *
           ((auVar35._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar16) - 4503599627370496.0))) /
           ((auVar36._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0));
  pAVar33->__boundLast = dVar23;
  if (dVar23 < pAVar33->__boundMin) {
    pAVar33->__boundMin = dVar23;
  }
  local_c8 = dVar30;
  local_a0 = uVar10;
  if (puVar14 != (uint *)0x0) {
    operator_delete(puVar14,(long)local_68.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar14)
    ;
  }
LAB_00105509:
  iVar3._M_current =
       (pAVar33->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (local_100 <=
      (ulong)((long)iVar3._M_current -
              (long)(pAVar33->__vecSeed).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2)) {
    uVar9 = pAVar33->__numV;
    local_c8 = (double)pAVar33->__numRRsets;
    uStack_c0 = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  >>>[greedy-lazy] influence: ",0x1e);
    local_c8 = ((double)uVar9 *
               (((double)CONCAT44(0x45300000,(int)((ulong)local_a8 >> 0x20)) -
                1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_a8) - 4503599627370496.0))) /
               (((double)CONCAT44(0x45300000,local_c8._4_4_) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(undefined4)local_c8) - 4503599627370496.0));
    poVar11 = std::ostream::_M_insert<double>(local_c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,", min-bound: ",0xd);
    poVar11 = std::ostream::_M_insert<double>(pAVar33->__boundMin);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,", last-bound: ",0xe);
    poVar11 = std::ostream::_M_insert<double>(pAVar33->__boundLast);
    local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,(char *)&local_68,1);
    bVar34 = false;
    goto LAB_0010577d;
  }
  if (iVar3._M_current ==
      (pAVar33->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              (local_48,iVar3,&local_12c);
  }
  else {
    *iVar3._M_current = local_12c;
    (pAVar33->__vecSeed).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  local_a8 = local_a8 + uVar10;
  uVar10 = (ulong)local_12c;
  local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[uVar10] = 0;
  pvVar5 = (pAVar33->__hyperG)._FRsets.
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar18 = pvVar5[uVar10].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start;
  puVar6 = *(pointer *)
            ((long)&pvVar5[uVar10].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data + 8);
  uVar21 = uVar20;
  if (puVar18 != puVar6) {
    pvVar7 = (pAVar33->__hyperG)._RRsets.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar10 = *puVar18;
      uVar31 = uVar10 + 0x3f;
      if (-1 < (long)uVar10) {
        uVar31 = uVar10;
      }
      uVar22 = (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001);
      if ((local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[((long)uVar31 >> 6) + (uVar22 - 1)] >>
           (uVar10 & 0x3f) & 1) == 0) {
        local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[((long)uVar31 >> 6) + (uVar22 - 1)] =
             local_98.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[((long)uVar31 >> 6) + (uVar22 - 1)] |
             1L << ((byte)uVar10 & 0x3f);
        puVar17 = *(pointer *)
                   ((long)&pvVar7[uVar10].
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data + 8);
        for (puVar14 = pvVar7[uVar10].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar14 != puVar17; puVar14 = puVar14 + 1)
        {
          if (local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[*puVar14] != 0) {
            local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[*puVar14] =
                 local_e0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[*puVar14] - 1;
          }
        }
      }
      puVar18 = puVar18 + 1;
      uVar21 = local_b0;
    } while (puVar18 != puVar6);
  }
LAB_00105626:
  dVar30 = (double)((long)dVar30 + -1);
  lVar27 = lVar27 + 1;
  local_70 = local_70 + -4;
  if (dVar30 == 0.0) goto LAB_00105650;
  goto LAB_00105047;
}

Assistant:

double Alg::max_cover_lazy(const int targetSize, const int mode)
{
    // mode: optimization mode.
    // 0->no optimization,
    // 1->optimization with the upper bound in the last round,
    // 2->optimization with minimum upper bound among all rounds [Default].
    __boundLast = DBL_MAX, __boundMin = DBL_MAX;
    FRset coverage(__numV, 0);
    size_t maxDeg = 0;
    for (auto i = __numV; i--;)
    {
        const auto deg = __hyperG._FRsets[i].size();
        coverage[i] = deg;
        if (deg > maxDeg) maxDeg = deg;
    }
    RRsets degMap(maxDeg + 1); // degMap: map degree to the nodes with this degree
    for (auto i = __numV; i--;)
    {
        if (coverage[i] == 0) continue;
        degMap[coverage[i]].push_back(i);
    }
    size_t sumInf = 0;

    // check if an edge is removed
    std::vector<bool> edgeMark(__numRRsets, false);

    __vecSeed.clear();
    for (auto deg = maxDeg; deg > 0; deg--) // Enusre deg > 0
    {
        auto& vecNode = degMap[deg];
        for (auto idx = vecNode.size(); idx--;)
        {
            auto argmaxIdx = vecNode[idx];
            const auto currDeg = coverage[argmaxIdx];
            if (deg > currDeg)
            {
                degMap[currDeg].push_back(argmaxIdx);
                continue;
            }
            if (mode == 2 || (mode == 1 && __vecSeed.size() == targetSize))
            {
                // Find upper bound
                auto topk = targetSize;
                auto degBound = deg;
                Nodelist vecBound(targetSize);
                // Initialize vecBound
                auto idxBound = idx + 1;
                while (topk && idxBound--)
                {
                    vecBound[--topk] = coverage[degMap[degBound][idxBound]];
                }
                while (topk && --degBound)
                {
                    idxBound = degMap[degBound].size();
                    while (topk && idxBound--)
                    {
                        vecBound[--topk] = coverage[degMap[degBound][idxBound]];
                    }
                }
                make_min_heap(vecBound);

                // Find the top-k marginal coverage
                auto flag = topk == 0;
                while (flag && idxBound--)
                {
                    const auto currDegBound = coverage[degMap[degBound][idxBound]];
                    if (vecBound[0] >= degBound)
                    {
                        flag = false;
                    }
                    else if (vecBound[0] < currDegBound)
                    {
                        min_heap_replace_min_value(vecBound, currDegBound);
                    }
                }
                while (flag && --degBound)
                {
                    idxBound = degMap[degBound].size();
                    while (flag && idxBound--)
                    {
                        const auto currDegBound = coverage[degMap[degBound][idxBound]];
                        if (vecBound[0] >= degBound)
                        {
                            flag = false;
                        }
                        else if (vecBound[0] < currDegBound)
                        {
                            min_heap_replace_min_value(vecBound, currDegBound);
                        }
                    }
                }
                __boundLast = double(accumulate(vecBound.begin(), vecBound.end(), size_t(0)) + sumInf) *
                        __numV / __numRRsets;
                if (__boundMin > __boundLast) __boundMin = __boundLast;
            }
            if (__vecSeed.size() >= targetSize)
            {
                // Top-k influential nodes constructed
                const auto finalInf = 1.0 * sumInf * __numV / __numRRsets;
                std::cout << "  >>>[greedy-lazy] influence: " << finalInf << ", min-bound: " << __boundMin <<
                          ", last-bound: " << __boundLast << '\n';
                return finalInf;
            }
            sumInf = sumInf + currDeg;
            __vecSeed.push_back(argmaxIdx);
            coverage[argmaxIdx] = 0;
            for (auto edgeIdx : __hyperG._FRsets[argmaxIdx])
            {
                if (edgeMark[edgeIdx]) continue;
                edgeMark[edgeIdx] = true;
                for (auto nodeIdx : __hyperG._RRsets[edgeIdx])
                {
                    if (coverage[nodeIdx] == 0) continue; // This node is seed, skip
                    coverage[nodeIdx]--;
                }
            }
        }
        degMap.pop_back();
    }
    return 1.0 * __numV; // All RR sets are covered.
}